

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall
ExpressionContext::AddVariable(ExpressionContext *this,VariableData *variable,bool visible)

{
  ScopeData *pSVar1;
  uint uVar2;
  IdentifierLookupResult local_40;
  IdentifierLookupResult local_30;
  byte local_19;
  VariableData *pVStack_18;
  bool visible_local;
  VariableData *variable_local;
  ExpressionContext *this_local;
  
  local_19 = visible;
  pVStack_18 = variable;
  variable_local = (VariableData *)this;
  SmallArray<VariableData_*,_4U>::push_back(&this->scope->variables,&stack0xffffffffffffffe8);
  SmallArray<VariableData_*,_4U>::push_back(&this->scope->allVariables,&stack0xffffffffffffffe8);
  SmallArray<VariableData_*,_128U>::push_back(&this->variables,&stack0xffffffffffffffe8);
  if ((local_19 & 1) != 0) {
    if (this->scope->type == SCOPE_NAMESPACE) {
      pSVar1 = this->globalScope;
      uVar2 = InplaceStr::hash(&pVStack_18->name->name);
      IdentifierLookupResult::IdentifierLookupResult(&local_30,pVStack_18);
      DirectChainedMap<IdentifierLookupResult>::insert(&pSVar1->idLookupMap,uVar2,local_30);
    }
    else {
      pSVar1 = this->scope;
      uVar2 = InplaceStr::hash(&pVStack_18->name->name);
      IdentifierLookupResult::IdentifierLookupResult(&local_40,pVStack_18);
      DirectChainedMap<IdentifierLookupResult>::insert(&pSVar1->idLookupMap,uVar2,local_40);
    }
  }
  return;
}

Assistant:

void ExpressionContext::AddVariable(VariableData *variable, bool visible)
{
	scope->variables.push_back(variable);
	scope->allVariables.push_back(variable);

	variables.push_back(variable);

	if(visible)
	{
		if(scope->type == SCOPE_NAMESPACE)
			globalScope->idLookupMap.insert(variable->name->name.hash(), IdentifierLookupResult(variable));
		else
			scope->idLookupMap.insert(variable->name->name.hash(), IdentifierLookupResult(variable));
	}
}